

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

void nghttp2_bufs_reset(nghttp2_bufs *bufs)

{
  size_t sVar1;
  size_t local_28;
  size_t k;
  nghttp2_buf_chain *ci;
  nghttp2_buf_chain *chain;
  nghttp2_bufs *bufs_local;
  
  local_28 = bufs->chunk_keep;
  for (k = (size_t)bufs->head; k != 0; k = *(size_t *)k) {
    nghttp2_buf_reset((nghttp2_buf *)(k + 8));
    *(size_t *)(k + 0x18) = bufs->offset + *(long *)(k + 0x18);
    *(size_t *)(k + 0x20) = bufs->offset + *(long *)(k + 0x20);
    local_28 = local_28 - 1;
    if (local_28 == 0) break;
  }
  if (k != 0) {
    sVar1 = *(size_t *)k;
    *(undefined8 *)k = 0;
    k = sVar1;
    while (k != 0) {
      sVar1 = *(size_t *)k;
      buf_chain_del((nghttp2_buf_chain *)k,bufs->mem);
      k = sVar1;
    }
    bufs->chunk_used = bufs->chunk_keep;
  }
  bufs->cur = bufs->head;
  return;
}

Assistant:

void nghttp2_bufs_reset(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *chain, *ci;
  size_t k;

  k = bufs->chunk_keep;

  for (ci = bufs->head; ci; ci = ci->next) {
    nghttp2_buf_reset(&ci->buf);
    nghttp2_buf_shift_right(&ci->buf, bufs->offset);

    if (--k == 0) {
      break;
    }
  }

  if (ci) {
    chain = ci->next;
    ci->next = NULL;

    for (ci = chain; ci;) {
      chain = ci->next;

      buf_chain_del(ci, bufs->mem);

      ci = chain;
    }

    bufs->chunk_used = bufs->chunk_keep;
  }

  bufs->cur = bufs->head;
}